

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O3

void column_test_boundary_z2_operators<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>>
               (vector<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>_>
                *matrix)

{
  ulong *puVar1;
  uint uVar2;
  pointer pUVar3;
  _Hash_node_base *p_Var4;
  bool bVar5;
  _Hash_node_base *p_Var6;
  _Hash_node_base *p_Var7;
  uint uVar8;
  _Bit_const_iterator __first1;
  _Bit_const_iterator __first1_00;
  _Bit_const_iterator __first1_01;
  _Bit_const_iterator __first1_02;
  _Bit_const_iterator __first1_03;
  _Bit_const_iterator __first1_04;
  _Bit_const_iterator __last1;
  _Bit_const_iterator __last1_00;
  _Bit_const_iterator __last1_01;
  _Bit_const_iterator __last1_02;
  _Bit_const_iterator __last1_03;
  _Bit_const_iterator __last1_04;
  _Bit_const_iterator __first2;
  _Bit_const_iterator __first2_00;
  _Bit_const_iterator __first2_01;
  _Bit_const_iterator __first2_02;
  _Bit_const_iterator __first2_03;
  _Bit_const_iterator __first2_04;
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<unsigned_int> __l_01;
  initializer_list<unsigned_int> __l_02;
  Column_settings settings;
  void *local_4e0;
  undefined4 local_4d8;
  long local_4d0;
  uint local_4c8;
  long local_4c0;
  undefined1 local_4b8 [8];
  pointer puStack_4b0;
  shared_count sStack_4a8;
  undefined8 local_4a0;
  _Bit_pointer local_498;
  __node_base local_490;
  __node_base_ptr local_488;
  char *pcStack_480;
  shared_count sStack_478;
  __node_base *local_470;
  _Hash_node_base local_460;
  __node_base local_458;
  char *local_450;
  Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>
  col2;
  __node_base local_3e0;
  char *local_3d8;
  shared_count sStack_3d0;
  Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>
  col4;
  __node_base *local_368;
  char *local_360;
  shared_count sStack_358;
  char *local_350;
  Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>
  col3;
  _Hash_node_base local_2e0;
  Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>
  col1;
  undefined1 local_274 [12];
  undefined1 *local_268;
  char *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  undefined1 *local_240;
  undefined1 *local_238;
  char *local_230;
  char *local_228;
  undefined1 *local_220;
  undefined1 *local_218;
  char *local_210;
  char *local_208;
  char *local_200;
  char *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  char *local_1e0;
  char *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  char *local_190;
  char *local_188;
  undefined1 *local_180;
  undefined1 *local_178;
  char *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>
  col0;
  
  local_4e0 = (void *)0x0;
  local_4d8 = 0;
  local_4d0 = 0;
  local_4c8 = 0;
  local_4c0 = 0;
  col2.super_Row_access_option.columnIndex_ = 0;
  col2.super_Row_access_option._4_4_ = 1;
  col2.super_Row_access_option.rows_ = (Row_container *)0x500000002;
  col2.super_Column_dimension_option.dim_ = 6;
  __l._M_len = 5;
  __l._M_array = (iterator)&col2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&col1,__l,
             (allocator_type *)&col3);
  Gudhi::persistence_matrix::
  Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>
  ::Unordered_set_column<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>
              *)&col0,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&col1,&settings);
  if (col1.super_Row_access_option._0_8_ != 0) {
    operator_delete((void *)col1.super_Row_access_option._0_8_,
                    col1._16_8_ - col1.super_Row_access_option._0_8_);
  }
  Gudhi::persistence_matrix::
  Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>
  ::
  _generic_add<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>,Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>::_add<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>>(Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>const&)::_lambda(Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>const&,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>*)_1_,Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>::_add<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>>(Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>const&)::_lambda(Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>const&)_1_>
            ((Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>
              *)(matrix->
                super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start,&col0,(anon_class_1_0_00000001 *)&col1,
             (anon_class_1_0_00000001 *)&col2);
  col1.super_Row_access_option._0_7_ = 0x1000001010000;
  std::vector<bool,std::allocator<bool>>::_M_assign_aux<bool_const*>
            ((vector<bool,std::allocator<bool>> *)&local_4e0,&col1);
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x3bf);
  pUVar3 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar8 = ((int)local_4d0 - (int)local_4e0) * 8 + local_4c8;
  if ((int)uVar8 < 0) {
    if ((pUVar3->column_)._M_h._M_element_count != 0) {
      p_Var6 = (pUVar3->column_)._M_h._M_before_begin._M_nxt;
      p_Var4 = p_Var6->_M_nxt;
      for (; p_Var4 != (_Hash_node_base *)0x0; p_Var4 = p_Var4->_M_nxt) {
        p_Var7 = p_Var4;
        if (*(uint *)&p_Var4[1]._M_nxt[3]._M_nxt <= *(uint *)&p_Var6[1]._M_nxt[3]._M_nxt) {
          p_Var7 = p_Var6;
        }
        p_Var6 = p_Var7;
      }
      uVar8 = *(int *)&p_Var6[1]._M_nxt[3]._M_nxt + 1;
      goto LAB_0015d6e3;
    }
    col1.super_Column_dimension_option.dim_ = 0;
    col1._20_4_ = 0;
    col1.column_._M_h._M_buckets._0_4_ = 0;
    col1.column_._M_h._M_buckets._4_4_ = 0;
    col1.super_Row_access_option.columnIndex_ = 0;
    col1.super_Row_access_option._4_4_ = 0;
    col1.super_Row_access_option.rows_ = (Row_container *)0x0;
    col1.column_._M_h._M_bucket_count = 0;
  }
  else {
LAB_0015d6e3:
    col2.super_Row_access_option._0_8_ = col2.super_Row_access_option._0_8_ & 0xffffffffffffff00;
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)&col1,(long)(int)uVar8,(bool *)&col2,
               (allocator_type *)&col4);
    for (p_Var6 = (pUVar3->column_)._M_h._M_before_begin._M_nxt; p_Var6 != (_Hash_node_base *)0x0;
        p_Var6 = p_Var6->_M_nxt) {
      uVar2 = *(uint *)&p_Var6[1]._M_nxt[3]._M_nxt;
      if (uVar2 < uVar8) {
        puVar1 = (ulong *)(col1.super_Row_access_option._0_8_ + (ulong)(uVar2 >> 6) * 8);
        *puVar1 = *puVar1 | 1L << ((byte)uVar2 & 0x3f);
      }
    }
  }
  __last1.super__Bit_iterator_base._M_offset = (uint)col1.column_._M_h._M_buckets;
  __last1.super__Bit_iterator_base._M_p = (_Bit_type *)col1._16_8_;
  if ((ulong)(uint)col1.column_._M_h._M_buckets +
      (col1._16_8_ - col1.super_Row_access_option._0_8_) * 8 ==
      (ulong)local_4c8 + (local_4d0 - (long)local_4e0) * 8) {
    __first1.super__Bit_iterator_base._8_8_ = 0;
    __first1.super__Bit_iterator_base._M_p = (_Bit_type *)col1.super_Row_access_option._0_8_;
    __last1.super__Bit_iterator_base._12_4_ = 0;
    __first2.super__Bit_iterator_base._8_8_ = 0;
    __first2.super__Bit_iterator_base._M_p = (_Bit_type *)local_4e0;
    bVar5 = std::__equal<false>::equal<std::_Bit_const_iterator,std::_Bit_const_iterator>
                      (__first1,__last1,__first2);
  }
  else {
    bVar5 = false;
  }
  col3.super_Row_access_option.columnIndex_._0_1_ = bVar5;
  col3.super_Row_access_option.rows_ = (Row_container *)0x0;
  col3.super_Column_dimension_option.dim_ = 0;
  col3._20_4_ = 0;
  col2.column_._M_h._M_buckets = (__buckets_ptr)&col4;
  col4.super_Row_access_option._0_8_ = anon_var_dwarf_c4d0f;
  col4.super_Row_access_option.rows_ = (Row_container *)0x1ec5a9;
  col2.super_Row_access_option.rows_ =
       (Row_container *)((ulong)col2.super_Row_access_option.rows_ & 0xffffffffffffff00);
  col2.super_Row_access_option._0_8_ = &PTR__lazy_ostream_002283b0;
  col2.super_Column_dimension_option.dim_ = 0x230120;
  col2._20_4_ = 0;
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_b8 = "";
  boost::test_tools::tt_detail::report_assertion(&col3,&col2,&local_c0,0x3bf,1,0,0);
  boost::detail::shared_count::~shared_count((shared_count *)&col3.super_Column_dimension_option);
  if (col1.super_Row_access_option._0_8_ != 0) {
    operator_delete((void *)col1.super_Row_access_option._0_8_,
                    col1.column_._M_h._M_bucket_count - col1.super_Row_access_option._0_8_);
  }
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_c8 = "";
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0x3c1);
  col3.super_Row_access_option.rows_ =
       (Row_container *)((ulong)col3.super_Row_access_option.rows_ & 0xffffffffffffff00);
  col3.super_Row_access_option._0_8_ = &PTR__lazy_ostream_00228440;
  col3.super_Column_dimension_option.dim_ = 0x230120;
  col3._20_4_ = 0;
  col3.column_._M_h._M_buckets._0_4_ = 0x1e61b6;
  col3.column_._M_h._M_buckets._4_4_ = 0;
  local_3e0._M_nxt =
       (_Hash_node_base *)
       (((matrix->
         super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start)->column_)._M_h._M_element_count;
  local_488 = &local_3e0;
  local_368 = &local_458;
  col4.super_Row_access_option.columnIndex_._0_1_ = local_3e0._M_nxt == (_Hash_node_base *)0x3;
  local_458._M_nxt._0_4_ = 3;
  col4.super_Row_access_option.rows_ = (Row_container *)0x0;
  col4.super_Column_dimension_option.dim_ = 0;
  col4._20_4_ = 0;
  local_4b8 = (undefined1  [8])0x1e68bf;
  puStack_4b0 = (pointer)0x1e6932;
  col1.column_._M_h._M_buckets = &local_488;
  col1.super_Row_access_option.rows_ =
       (Row_container *)((ulong)col1.super_Row_access_option.rows_ & 0xffffffffffffff00);
  col1.super_Row_access_option._0_8_ = &PTR__lazy_ostream_00228400;
  col1._16_8_ = &boost::unit_test::lazy_ostream::inst;
  col2.column_._M_h._M_buckets = &local_368;
  col2.super_Row_access_option.rows_ =
       (Row_container *)((ulong)col2.super_Row_access_option.rows_ & 0xffffffffffffff00);
  col2.super_Row_access_option._0_8_ = &PTR__lazy_ostream_002286c0;
  col2.super_Column_dimension_option.dim_ = 0x230120;
  col2._20_4_ = 0;
  boost::test_tools::tt_detail::report_assertion
            (&col4,&col3,local_4b8,0x3c1,1,2,2,"matrix[0].size()",&col1,"3",&col2);
  boost::detail::shared_count::~shared_count((shared_count *)&col4.super_Column_dimension_option);
  col3.super_Row_access_option.columnIndex_ = 0;
  col3.super_Row_access_option._4_4_ = 1;
  col3.super_Row_access_option.rows_ = (Row_container *)0x500000002;
  col3.super_Column_dimension_option.dim_ = 6;
  __l_00._M_len = 5;
  __l_00._M_array = (iterator)&col3;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&col2,__l_00,
             (allocator_type *)&col4);
  Gudhi::persistence_matrix::
  Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>
  ::Unordered_set_column<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>
              *)&col1,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&col2,&settings);
  if (col2.super_Row_access_option._0_8_ != 0) {
    operator_delete((void *)col2.super_Row_access_option._0_8_,
                    CONCAT44(col2._20_4_,col2.super_Column_dimension_option.dim_) -
                    col2.super_Row_access_option._0_8_);
  }
  Gudhi::persistence_matrix::
  Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>
  ::
  _generic_add<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>,Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>::_add<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>>(Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>const&)::_lambda(Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>const&,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>*)_1_,Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>::_add<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>>(Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>const&)::_lambda(Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>const&)_1_>
            ((Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>
              *)((matrix->
                 super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 1),&col1,
             (anon_class_1_0_00000001 *)&col2,(anon_class_1_0_00000001 *)&col3);
  std::vector<bool,std::allocator<bool>>::_M_assign_aux<bool_const*>
            ((vector<bool,std::allocator<bool>> *)&local_4e0,0,0);
  local_f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_e8 = "";
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_f0,0x3c8);
  pUVar3 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar8 = ((int)local_4d0 - (int)local_4e0) * 8 + local_4c8;
  if ((int)uVar8 < 0) {
    if (pUVar3[1].column_._M_h._M_element_count != 0) {
      p_Var6 = pUVar3[1].column_._M_h._M_before_begin._M_nxt;
      p_Var4 = p_Var6->_M_nxt;
      for (; p_Var4 != (_Hash_node_base *)0x0; p_Var4 = p_Var4->_M_nxt) {
        p_Var7 = p_Var4;
        if (*(uint *)&p_Var4[1]._M_nxt[3]._M_nxt <= *(uint *)&p_Var6[1]._M_nxt[3]._M_nxt) {
          p_Var7 = p_Var6;
        }
        p_Var6 = p_Var7;
      }
      uVar8 = *(int *)&p_Var6[1]._M_nxt[3]._M_nxt + 1;
      goto LAB_0015ecee;
    }
    col2.super_Column_dimension_option.dim_ = 0;
    col2._20_4_ = 0;
    col2.column_._M_h._M_buckets = (__buckets_ptr)0x0;
    col2.super_Row_access_option.columnIndex_ = 0;
    col2.super_Row_access_option._4_4_ = 0;
    col2.super_Row_access_option.rows_ = (Row_container *)0x0;
    col2.column_._M_h._M_bucket_count = 0;
  }
  else {
LAB_0015ecee:
    col3.super_Row_access_option._0_8_ = col3.super_Row_access_option._0_8_ & 0xffffffffffffff00;
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)&col2,(long)(int)uVar8,(bool *)&col3,
               (allocator_type *)local_4b8);
    for (p_Var6 = pUVar3[1].column_._M_h._M_before_begin._M_nxt; p_Var6 != (_Hash_node_base *)0x0;
        p_Var6 = p_Var6->_M_nxt) {
      uVar2 = *(uint *)&p_Var6[1]._M_nxt[3]._M_nxt;
      if (uVar2 < uVar8) {
        puVar1 = (ulong *)(col2.super_Row_access_option._0_8_ + (ulong)(uVar2 >> 6) * 8);
        *puVar1 = *puVar1 | 1L << ((byte)uVar2 & 0x3f);
      }
    }
  }
  __last1_00.super__Bit_iterator_base._M_p._4_4_ = col2._20_4_;
  __last1_00.super__Bit_iterator_base._M_p._0_4_ = col2.super_Column_dimension_option.dim_;
  __last1_00.super__Bit_iterator_base._M_offset = col2.column_._M_h._M_buckets._0_4_;
  if (((ulong)col2.column_._M_h._M_buckets & 0xffffffff) +
      (CONCAT44(col2._20_4_,col2.super_Column_dimension_option.dim_) -
      col2.super_Row_access_option._0_8_) * 8 ==
      (ulong)local_4c8 + (local_4d0 - (long)local_4e0) * 8) {
    __first1_00.super__Bit_iterator_base._8_8_ = 0;
    __first1_00.super__Bit_iterator_base._M_p = (_Bit_type *)col2.super_Row_access_option._0_8_;
    __last1_00.super__Bit_iterator_base._12_4_ = 0;
    __first2_00.super__Bit_iterator_base._8_8_ = 0;
    __first2_00.super__Bit_iterator_base._M_p = (_Bit_type *)local_4e0;
    bVar5 = std::__equal<false>::equal<std::_Bit_const_iterator,std::_Bit_const_iterator>
                      (__first1_00,__last1_00,__first2_00);
  }
  else {
    bVar5 = false;
  }
  col4.super_Row_access_option.columnIndex_._0_1_ = bVar5;
  col4.super_Row_access_option.rows_ = (Row_container *)0x0;
  col4.super_Column_dimension_option.dim_ = 0;
  col4._20_4_ = 0;
  local_4b8 = (undefined1  [8])0x1ec5bd;
  puStack_4b0 = (pointer)0x1ec5ed;
  col3.super_Row_access_option.rows_ =
       (Row_container *)((ulong)col3.super_Row_access_option.rows_ & 0xffffffffffffff00);
  col3.super_Row_access_option._0_8_ = &PTR__lazy_ostream_002283b0;
  col3.super_Column_dimension_option.dim_ = 0x230120;
  col3._20_4_ = 0;
  local_110 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_108 = "";
  col3.column_._M_h._M_buckets = (__buckets_ptr)local_4b8;
  boost::test_tools::tt_detail::report_assertion(&col4,&col3,&local_110,0x3c8,1,0,0);
  boost::detail::shared_count::~shared_count((shared_count *)&col4.super_Column_dimension_option);
  if (col2.super_Row_access_option._0_8_ != 0) {
    operator_delete((void *)col2.super_Row_access_option._0_8_,
                    col2.column_._M_h._M_bucket_count - col2.super_Row_access_option._0_8_);
  }
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_118 = "";
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_120,0x3ca);
  col4.super_Row_access_option.rows_ =
       (Row_container *)((ulong)col4.super_Row_access_option.rows_ & 0xffffffffffffff00);
  col4.super_Row_access_option._0_8_ = &PTR__lazy_ostream_00228440;
  col4._16_8_ = &boost::unit_test::lazy_ostream::inst;
  col4.column_._M_h._M_buckets._0_4_ = 0x1e61b6;
  col4.column_._M_h._M_buckets._4_4_ = 0;
  local_458._M_nxt =
       (_Hash_node_base *)
       (matrix->
       super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start[1].column_._M_h._M_element_count;
  local_3e0._M_nxt = &local_490;
  local_4b8[0] = local_458._M_nxt == (_Hash_node_base *)0x0;
  local_490._M_nxt = (_Hash_node_base *)((ulong)local_490._M_nxt._4_4_ << 0x20);
  puStack_4b0 = (pointer)0x0;
  sStack_4a8.pi_ = (sp_counted_base *)0x0;
  col2.super_Row_access_option.rows_ =
       (Row_container *)((ulong)col2.super_Row_access_option.rows_ & 0xffffffffffffff00);
  col3.super_Row_access_option.rows_ =
       (Row_container *)((ulong)col3.super_Row_access_option.rows_ & 0xffffffffffffff00);
  local_488 = (__node_base_ptr)0x1e68bf;
  pcStack_480 = "";
  local_368 = &local_458;
  col2.super_Row_access_option._0_8_ = &PTR__lazy_ostream_00228400;
  col2.super_Column_dimension_option.dim_ = 0x230120;
  col2._20_4_ = 0;
  col2.column_._M_h._M_buckets = &local_368;
  col3.super_Row_access_option._0_8_ = &PTR__lazy_ostream_002286c0;
  col3.super_Column_dimension_option.dim_ = 0x230120;
  col3._20_4_ = 0;
  col3.column_._M_h._M_buckets = &local_3e0._M_nxt;
  boost::test_tools::tt_detail::report_assertion
            (local_4b8,&col4,&local_488,0x3ca,1,2,2,"matrix[1].size()",&col2,"0",&col3);
  boost::detail::shared_count::~shared_count(&sStack_4a8);
  Gudhi::persistence_matrix::
  Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>
  ::
  _generic_add<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>,Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>::_add<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>>(Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>const&)::_lambda(Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>const&,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>*)_1_,Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>::_add<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>>(Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>const&)::_lambda(Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>const&)_1_>
            ((Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>
              *)((matrix->
                 super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 4),&col1,
             (anon_class_1_0_00000001 *)&col2,(anon_class_1_0_00000001 *)&col3);
  col2.super_Row_access_option._0_7_ = 0x1000001010000;
  std::vector<bool,std::allocator<bool>>::_M_assign_aux<bool_const*>
            ((vector<bool,std::allocator<bool>> *)&local_4e0,&col2);
  local_140 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_138 = "";
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_140,0x3d0);
  pUVar3 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar8 = ((int)local_4d0 - (int)local_4e0) * 8 + local_4c8;
  if ((int)uVar8 < 0) {
    if (pUVar3[4].column_._M_h._M_element_count != 0) {
      p_Var6 = pUVar3[4].column_._M_h._M_before_begin._M_nxt;
      p_Var4 = p_Var6->_M_nxt;
      for (; p_Var4 != (_Hash_node_base *)0x0; p_Var4 = p_Var4->_M_nxt) {
        p_Var7 = p_Var4;
        if (*(uint *)&p_Var4[1]._M_nxt[3]._M_nxt <= *(uint *)&p_Var6[1]._M_nxt[3]._M_nxt) {
          p_Var7 = p_Var6;
        }
        p_Var6 = p_Var7;
      }
      uVar8 = *(int *)&p_Var6[1]._M_nxt[3]._M_nxt + 1;
      goto LAB_0015ed54;
    }
    col2.super_Column_dimension_option.dim_ = 0;
    col2._20_4_ = 0;
    col2.column_._M_h._M_buckets = (__buckets_ptr)0x0;
    col2.super_Row_access_option.columnIndex_ = 0;
    col2.super_Row_access_option._4_4_ = 0;
    col2.super_Row_access_option.rows_ = (Row_container *)0x0;
    col2.column_._M_h._M_bucket_count = 0;
  }
  else {
LAB_0015ed54:
    col3.super_Row_access_option._0_8_ = col3.super_Row_access_option._0_8_ & 0xffffffffffffff00;
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)&col2,(long)(int)uVar8,(bool *)&col3,
               (allocator_type *)local_4b8);
    for (p_Var6 = pUVar3[4].column_._M_h._M_before_begin._M_nxt; p_Var6 != (_Hash_node_base *)0x0;
        p_Var6 = p_Var6->_M_nxt) {
      uVar2 = *(uint *)&p_Var6[1]._M_nxt[3]._M_nxt;
      if (uVar2 < uVar8) {
        puVar1 = (ulong *)(col2.super_Row_access_option._0_8_ + (ulong)(uVar2 >> 6) * 8);
        *puVar1 = *puVar1 | 1L << ((byte)uVar2 & 0x3f);
      }
    }
  }
  __last1_01.super__Bit_iterator_base._M_p._4_4_ = col2._20_4_;
  __last1_01.super__Bit_iterator_base._M_p._0_4_ = col2.super_Column_dimension_option.dim_;
  __last1_01.super__Bit_iterator_base._M_offset = col2.column_._M_h._M_buckets._0_4_;
  if (((ulong)col2.column_._M_h._M_buckets & 0xffffffff) +
      (CONCAT44(col2._20_4_,col2.super_Column_dimension_option.dim_) -
      col2.super_Row_access_option._0_8_) * 8 ==
      (ulong)local_4c8 + (local_4d0 - (long)local_4e0) * 8) {
    __first1_01.super__Bit_iterator_base._8_8_ = 0;
    __first1_01.super__Bit_iterator_base._M_p = (_Bit_type *)col2.super_Row_access_option._0_8_;
    __last1_01.super__Bit_iterator_base._12_4_ = 0;
    __first2_01.super__Bit_iterator_base._8_8_ = 0;
    __first2_01.super__Bit_iterator_base._M_p = (_Bit_type *)local_4e0;
    bVar5 = std::__equal<false>::equal<std::_Bit_const_iterator,std::_Bit_const_iterator>
                      (__first1_01,__last1_01,__first2_01);
  }
  else {
    bVar5 = false;
  }
  col4.super_Row_access_option.columnIndex_._0_1_ = bVar5;
  col4.super_Row_access_option.rows_ = (Row_container *)0x0;
  col4.super_Column_dimension_option.dim_ = 0;
  col4._20_4_ = 0;
  local_4b8 = (undefined1  [8])0x1ec601;
  puStack_4b0 = (pointer)0x1ec631;
  col3.super_Row_access_option.rows_ =
       (Row_container *)((ulong)col3.super_Row_access_option.rows_ & 0xffffffffffffff00);
  col3.super_Row_access_option._0_8_ = &PTR__lazy_ostream_002283b0;
  col3.super_Column_dimension_option.dim_ = 0x230120;
  col3._20_4_ = 0;
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_158 = "";
  col3.column_._M_h._M_buckets = (__buckets_ptr)local_4b8;
  boost::test_tools::tt_detail::report_assertion(&col4,&col3,&local_160,0x3d0,1,0,0);
  boost::detail::shared_count::~shared_count((shared_count *)&col4.super_Column_dimension_option);
  if (col2.super_Row_access_option._0_8_ != 0) {
    operator_delete((void *)col2.super_Row_access_option._0_8_,
                    col2.column_._M_h._M_bucket_count - col2.super_Row_access_option._0_8_);
  }
  local_170 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_168 = "";
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_170,0x3d2);
  col4.super_Row_access_option.rows_ =
       (Row_container *)((ulong)col4.super_Row_access_option.rows_ & 0xffffffffffffff00);
  col4.super_Row_access_option._0_8_ = &PTR__lazy_ostream_00228440;
  col4._16_8_ = &boost::unit_test::lazy_ostream::inst;
  col4.column_._M_h._M_buckets._0_4_ = 0x1e61b6;
  col4.column_._M_h._M_buckets._4_4_ = 0;
  local_458._M_nxt =
       (_Hash_node_base *)
       (matrix->
       super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start[4].column_._M_h._M_element_count;
  col2.super_Row_access_option.rows_ =
       (Row_container *)((ulong)col2.super_Row_access_option.rows_ & 0xffffffffffffff00);
  col2.super_Row_access_option._0_8_ = &PTR__lazy_ostream_00228400;
  col2.super_Column_dimension_option.dim_ = 0x230120;
  col2._20_4_ = 0;
  col2.column_._M_h._M_buckets = &local_368;
  local_4b8[0] = local_458._M_nxt == (_Hash_node_base *)0x3;
  local_490._M_nxt._0_4_ = 3;
  puStack_4b0 = (pointer)0x0;
  sStack_4a8.pi_ = (sp_counted_base *)0x0;
  col3.super_Row_access_option.rows_ =
       (Row_container *)((ulong)col3.super_Row_access_option.rows_ & 0xffffffffffffff00);
  local_488 = (__node_base_ptr)0x1e68bf;
  pcStack_480 = "";
  local_368 = &local_458;
  local_3e0._M_nxt = &local_490;
  col3.super_Row_access_option._0_8_ = &PTR__lazy_ostream_002286c0;
  col3.super_Column_dimension_option.dim_ = 0x230120;
  col3._20_4_ = 0;
  col3.column_._M_h._M_buckets = &local_3e0._M_nxt;
  boost::test_tools::tt_detail::report_assertion
            (local_4b8,&col4,&local_488,0x3d2,1,2,2,"matrix[4].size()",&col2,"3",&col3);
  boost::detail::shared_count::~shared_count(&sStack_4a8);
  col3.super_Row_access_option.columnIndex_ = 0;
  col3.super_Row_access_option._4_4_ = 0;
  col3.super_Row_access_option.rows_ = (Row_container *)0x0;
  col3.super_Column_dimension_option.dim_ = 0;
  col3._20_4_ = 0;
  Gudhi::persistence_matrix::
  Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>
  ::Unordered_set_column<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>
              *)&col2,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&col3,&settings);
  if (col3.super_Row_access_option._0_8_ != 0) {
    operator_delete((void *)col3.super_Row_access_option._0_8_,
                    CONCAT44(col3._20_4_,col3.super_Column_dimension_option.dim_) -
                    col3.super_Row_access_option._0_8_);
  }
  Gudhi::persistence_matrix::
  Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>
  ::
  _generic_add<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>,Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>::_add<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>>(Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>const&)::_lambda(Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>const&,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>*)_1_,Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>::_add<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>>(Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>const&)::_lambda(Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>const&)_1_>
            ((Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>
              *)((matrix->
                 super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 5),&col2,
             (anon_class_1_0_00000001 *)&col3,(anon_class_1_0_00000001 *)&col4);
  col3.super_Row_access_option._0_7_ = 0x1010000010101;
  std::vector<bool,std::allocator<bool>>::_M_assign_aux<bool_const*>
            ((vector<bool,std::allocator<bool>> *)&local_4e0,&col3);
  local_190 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_188 = "";
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_190,0x3d8);
  pUVar3 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar8 = ((int)local_4d0 - (int)local_4e0) * 8 + local_4c8;
  if ((int)uVar8 < 0) {
    if (pUVar3[5].column_._M_h._M_element_count != 0) {
      p_Var6 = pUVar3[5].column_._M_h._M_before_begin._M_nxt;
      p_Var4 = p_Var6->_M_nxt;
      for (; p_Var4 != (_Hash_node_base *)0x0; p_Var4 = p_Var4->_M_nxt) {
        p_Var7 = p_Var4;
        if (*(uint *)&p_Var4[1]._M_nxt[3]._M_nxt <= *(uint *)&p_Var6[1]._M_nxt[3]._M_nxt) {
          p_Var7 = p_Var6;
        }
        p_Var6 = p_Var7;
      }
      uVar8 = *(int *)&p_Var6[1]._M_nxt[3]._M_nxt + 1;
      goto LAB_0015edba;
    }
    col3.super_Column_dimension_option.dim_ = 0;
    col3._20_4_ = 0;
    col3.column_._M_h._M_buckets = (__buckets_ptr)0x0;
    col3.super_Row_access_option.columnIndex_ = 0;
    col3.super_Row_access_option._4_4_ = 0;
    col3.super_Row_access_option.rows_ = (Row_container *)0x0;
    col3.column_._M_h._M_bucket_count = 0;
  }
  else {
LAB_0015edba:
    col4.super_Row_access_option._0_8_ = col4.super_Row_access_option._0_8_ & 0xffffffffffffff00;
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)&col3,(long)(int)uVar8,(bool *)&col4,
               (allocator_type *)&local_488);
    for (p_Var6 = pUVar3[5].column_._M_h._M_before_begin._M_nxt; p_Var6 != (_Hash_node_base *)0x0;
        p_Var6 = p_Var6->_M_nxt) {
      uVar2 = *(uint *)&p_Var6[1]._M_nxt[3]._M_nxt;
      if (uVar2 < uVar8) {
        puVar1 = (ulong *)(col3.super_Row_access_option._0_8_ + (ulong)(uVar2 >> 6) * 8);
        *puVar1 = *puVar1 | 1L << ((byte)uVar2 & 0x3f);
      }
    }
  }
  __last1_02.super__Bit_iterator_base._M_p._4_4_ = col3._20_4_;
  __last1_02.super__Bit_iterator_base._M_p._0_4_ = col3.super_Column_dimension_option.dim_;
  __last1_02.super__Bit_iterator_base._M_offset = col3.column_._M_h._M_buckets._0_4_;
  if (((ulong)col3.column_._M_h._M_buckets & 0xffffffff) +
      (CONCAT44(col3._20_4_,col3.super_Column_dimension_option.dim_) -
      col3.super_Row_access_option._0_8_) * 8 ==
      (ulong)local_4c8 + (local_4d0 - (long)local_4e0) * 8) {
    __first1_02.super__Bit_iterator_base._8_8_ = 0;
    __first1_02.super__Bit_iterator_base._M_p = (_Bit_type *)col3.super_Row_access_option._0_8_;
    __last1_02.super__Bit_iterator_base._12_4_ = 0;
    __first2_02.super__Bit_iterator_base._8_8_ = 0;
    __first2_02.super__Bit_iterator_base._M_p = (_Bit_type *)local_4e0;
    bVar5 = std::__equal<false>::equal<std::_Bit_const_iterator,std::_Bit_const_iterator>
                      (__first1_02,__last1_02,__first2_02);
  }
  else {
    bVar5 = false;
  }
  local_4b8[0] = bVar5;
  puStack_4b0 = (pointer)0x0;
  sStack_4a8.pi_ = (sp_counted_base *)0x0;
  local_488 = (__node_base_ptr)0x1ec643;
  pcStack_480 = "";
  col4.super_Row_access_option.rows_ =
       (Row_container *)((ulong)col4.super_Row_access_option.rows_ & 0xffffffffffffff00);
  col4.super_Row_access_option._0_8_ = &PTR__lazy_ostream_002283b0;
  col4._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_1a8 = "";
  col4.column_._M_h._M_buckets = &local_488;
  boost::test_tools::tt_detail::report_assertion(local_4b8,&col4,&local_1b0,0x3d8,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_4a8);
  if (col3.super_Row_access_option._0_8_ != 0) {
    operator_delete((void *)col3.super_Row_access_option._0_8_,
                    col3.column_._M_h._M_bucket_count - col3.super_Row_access_option._0_8_);
  }
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_1b8 = "";
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1c0,0x3da);
  puStack_4b0 = (pointer)((ulong)puStack_4b0 & 0xffffffffffffff00);
  local_4b8 = (undefined1  [8])&PTR__lazy_ostream_00228440;
  sStack_4a8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4a0._0_4_ = 0x1e61b6;
  local_4a0._4_4_ = 0;
  local_490._M_nxt =
       (_Hash_node_base *)
       (matrix->
       super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start[5].column_._M_h._M_element_count;
  local_458._M_nxt = &local_460;
  col3.super_Row_access_option.rows_ =
       (Row_container *)((ulong)col3.super_Row_access_option.rows_ & 0xffffffffffffff00);
  col3.super_Row_access_option._0_8_ = &PTR__lazy_ostream_00228400;
  col3.super_Column_dimension_option.dim_ = 0x230120;
  col3._20_4_ = 0;
  col3.column_._M_h._M_buckets = &local_3e0._M_nxt;
  local_488 = (__node_base_ptr)CONCAT71(local_488._1_7_,local_490._M_nxt == (_Hash_node_base *)0x5);
  local_460._M_nxt._0_4_ = 5;
  pcStack_480 = (char *)0x0;
  sStack_478.pi_ = (sp_counted_base *)0x0;
  col4.super_Row_access_option.rows_ =
       (Row_container *)((ulong)col4.super_Row_access_option.rows_ & 0xffffffffffffff00);
  local_368 = (__node_base *)0x1e68bf;
  local_360 = "";
  local_3e0._M_nxt = &local_490;
  col4.super_Row_access_option._0_8_ = &PTR__lazy_ostream_002286c0;
  col4._16_8_ = &boost::unit_test::lazy_ostream::inst;
  col4.column_._M_h._M_buckets = &local_458._M_nxt;
  boost::test_tools::tt_detail::report_assertion
            (&local_488,local_4b8,&local_368,0x3da,1,2,2,"matrix[5].size()",&col3,"5",&col4);
  boost::detail::shared_count::~shared_count(&sStack_478);
  local_4b8 = (undefined1  [8])0x300000002;
  puStack_4b0 = (pointer)CONCAT44(puStack_4b0._4_4_,6);
  __l_01._M_len = 3;
  __l_01._M_array = (iterator)local_4b8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&col4,__l_01,
             (allocator_type *)&local_488);
  Gudhi::persistence_matrix::
  Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>
  ::Unordered_set_column<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>
              *)&col3,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&col4,&settings);
  if (col4.super_Row_access_option._0_8_ != 0) {
    operator_delete((void *)col4.super_Row_access_option._0_8_,
                    col4._16_8_ - col4.super_Row_access_option._0_8_);
  }
  Gudhi::persistence_matrix::
  Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>
  ::
  _generic_add<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>,Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>::_add<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>>(Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>const&)::_lambda(Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>const&,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>*)_1_,Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>::_add<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>>(Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>const&)::_lambda(Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>const&)_1_>
            ((Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>
              *)((matrix->
                 super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 5),&col3,
             (anon_class_1_0_00000001 *)&col4,(anon_class_1_0_00000001 *)local_4b8);
  col4.super_Row_access_option._0_7_ = 0x10001000101;
  std::vector<bool,std::allocator<bool>>::_M_assign_aux<bool_const*>
            ((vector<bool,std::allocator<bool>> *)&local_4e0,&col4);
  local_1e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_1d8 = "";
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1e0,0x3e0);
  pUVar3 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar8 = ((int)local_4d0 - (int)local_4e0) * 8 + local_4c8;
  if ((int)uVar8 < 0) {
    if (pUVar3[5].column_._M_h._M_element_count != 0) {
      p_Var6 = pUVar3[5].column_._M_h._M_before_begin._M_nxt;
      p_Var4 = p_Var6->_M_nxt;
      for (; p_Var4 != (_Hash_node_base *)0x0; p_Var4 = p_Var4->_M_nxt) {
        p_Var7 = p_Var4;
        if (*(uint *)&p_Var4[1]._M_nxt[3]._M_nxt <= *(uint *)&p_Var6[1]._M_nxt[3]._M_nxt) {
          p_Var7 = p_Var6;
        }
        p_Var6 = p_Var7;
      }
      uVar8 = *(int *)&p_Var6[1]._M_nxt[3]._M_nxt + 1;
      goto LAB_0015ee20;
    }
    col4.super_Column_dimension_option.dim_ = 0;
    col4._20_4_ = 0;
    col4.column_._M_h._M_buckets = (__buckets_ptr)0x0;
    col4.super_Row_access_option.columnIndex_ = 0;
    col4.super_Row_access_option._4_4_ = 0;
    col4.super_Row_access_option.rows_ = (Row_container *)0x0;
    col4.column_._M_h._M_bucket_count = 0;
  }
  else {
LAB_0015ee20:
    local_4b8 = (undefined1  [8])((ulong)local_4b8 & 0xffffffffffffff00);
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)&col4,(long)(int)uVar8,(bool *)local_4b8,
               (allocator_type *)&local_368);
    for (p_Var6 = pUVar3[5].column_._M_h._M_before_begin._M_nxt; p_Var6 != (_Hash_node_base *)0x0;
        p_Var6 = p_Var6->_M_nxt) {
      uVar2 = *(uint *)&p_Var6[1]._M_nxt[3]._M_nxt;
      if (uVar2 < uVar8) {
        puVar1 = (ulong *)(col4.super_Row_access_option._0_8_ + (ulong)(uVar2 >> 6) * 8);
        *puVar1 = *puVar1 | 1L << ((byte)uVar2 & 0x3f);
      }
    }
  }
  __last1_03.super__Bit_iterator_base._M_offset = col4.column_._M_h._M_buckets._0_4_;
  __last1_03.super__Bit_iterator_base._M_p = (_Bit_type *)col4._16_8_;
  if (((ulong)col4.column_._M_h._M_buckets & 0xffffffff) +
      (col4._16_8_ - col4.super_Row_access_option._0_8_) * 8 ==
      (ulong)local_4c8 + (local_4d0 - (long)local_4e0) * 8) {
    __first1_03.super__Bit_iterator_base._8_8_ = 0;
    __first1_03.super__Bit_iterator_base._M_p = (_Bit_type *)col4.super_Row_access_option._0_8_;
    __last1_03.super__Bit_iterator_base._12_4_ = 0;
    __first2_03.super__Bit_iterator_base._8_8_ = 0;
    __first2_03.super__Bit_iterator_base._M_p = (_Bit_type *)local_4e0;
    bVar5 = std::__equal<false>::equal<std::_Bit_const_iterator,std::_Bit_const_iterator>
                      (__first1_03,__last1_03,__first2_03);
  }
  else {
    bVar5 = false;
  }
  local_488 = (__node_base_ptr)CONCAT71(local_488._1_7_,bVar5);
  pcStack_480 = (char *)0x0;
  sStack_478.pi_ = (sp_counted_base *)0x0;
  local_368 = (__node_base *)0x1ec643;
  local_360 = "";
  puStack_4b0 = (pointer)((ulong)puStack_4b0 & 0xffffffffffffff00);
  local_4b8 = (undefined1  [8])&PTR__lazy_ostream_002283b0;
  sStack_4a8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_200 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_1f8 = "";
  local_4a0 = (__node_base *)&local_368;
  boost::test_tools::tt_detail::report_assertion(&local_488,local_4b8,&local_200,0x3e0,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_478);
  if (col4.super_Row_access_option._0_8_ != 0) {
    operator_delete((void *)col4.super_Row_access_option._0_8_,
                    col4.column_._M_h._M_bucket_count - col4.super_Row_access_option._0_8_);
  }
  local_210 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_208 = "";
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_210,0x3e2);
  pcStack_480 = (char *)((ulong)pcStack_480 & 0xffffffffffffff00);
  local_488 = (__node_base_ptr)&PTR__lazy_ostream_00228440;
  sStack_478.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_470 = (__node_base *)0x1e61b6;
  local_460._M_nxt =
       (_Hash_node_base *)
       (matrix->
       super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start[5].column_._M_h._M_element_count;
  local_490._M_nxt = &local_2e0;
  col4.super_Row_access_option.rows_ =
       (Row_container *)((ulong)col4.super_Row_access_option.rows_ & 0xffffffffffffff00);
  col4.super_Row_access_option._0_8_ = &PTR__lazy_ostream_00228400;
  col4._16_8_ = &boost::unit_test::lazy_ostream::inst;
  col4.column_._M_h._M_buckets = &local_458._M_nxt;
  local_368 = (__node_base *)CONCAT71(local_368._1_7_,local_460._M_nxt == (_Hash_node_base *)0x4);
  local_2e0._M_nxt._0_4_ = 4;
  local_360 = (char *)0x0;
  sStack_358.pi_ = (sp_counted_base *)0x0;
  puStack_4b0 = (pointer)((ulong)puStack_4b0 & 0xffffffffffffff00);
  local_3e0._M_nxt = (_Hash_node_base *)0x1e68bf;
  local_3d8 = "";
  local_458._M_nxt = &local_460;
  local_4b8 = (undefined1  [8])&PTR__lazy_ostream_002286c0;
  sStack_4a8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4a0 = &local_490;
  boost::test_tools::tt_detail::report_assertion
            (&local_368,&local_488,&local_3e0,0x3e2,1,2,2,"matrix[5].size()",&col4,"4",local_4b8);
  boost::detail::shared_count::~shared_count(&sStack_358);
  local_488 = (__node_base_ptr)0x100000000;
  pcStack_480 = (char *)0x500000003;
  __l_02._M_len = 4;
  __l_02._M_array = (iterator)&local_488;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_4b8,__l_02,
             (allocator_type *)&local_368);
  Gudhi::persistence_matrix::
  Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>
  ::Unordered_set_column<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>
              *)&col4,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_4b8,&settings);
  if (local_4b8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_4b8,(long)sStack_4a8.pi_ - (long)local_4b8);
  }
  Gudhi::persistence_matrix::
  Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>
  ::
  _generic_add<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>,Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>::_add<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>>(Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>const&)::_lambda(Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>const&,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>*)_1_,Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>::_add<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>>(Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>const&)::_lambda(Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>const&)_1_>
            ((Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,true>>>
              *)((matrix->
                 super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 3),&col4,
             (anon_class_1_0_00000001 *)local_4b8,(anon_class_1_0_00000001 *)&local_488);
  local_4b8._0_7_ = 0x10001000101;
  std::vector<bool,std::allocator<bool>>::_M_assign_aux<bool_const*>
            ((vector<bool,std::allocator<bool>> *)&local_4e0,local_4b8);
  local_230 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_228 = "";
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_230,1000);
  pUVar3 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar8 = ((int)local_4d0 - (int)local_4e0) * 8 + local_4c8;
  if ((int)uVar8 < 0) {
    if (pUVar3[3].column_._M_h._M_element_count == 0) {
      sStack_4a8.pi_ = (sp_counted_base *)0x0;
      local_4a0 = (__node_base *)0x0;
      local_4b8 = (undefined1  [8])0x0;
      puStack_4b0 = (pointer)0x0;
      local_498 = (_Bit_pointer)0x0;
      goto LAB_0015e8fb;
    }
    p_Var6 = pUVar3[3].column_._M_h._M_before_begin._M_nxt;
    p_Var4 = p_Var6->_M_nxt;
    for (; p_Var4 != (_Hash_node_base *)0x0; p_Var4 = p_Var4->_M_nxt) {
      p_Var7 = p_Var4;
      if (*(uint *)&p_Var4[1]._M_nxt[3]._M_nxt <= *(uint *)&p_Var6[1]._M_nxt[3]._M_nxt) {
        p_Var7 = p_Var6;
      }
      p_Var6 = p_Var7;
    }
    uVar8 = *(int *)&p_Var6[1]._M_nxt[3]._M_nxt + 1;
  }
  local_488 = (__node_base_ptr)((ulong)local_488 & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_4b8,(long)(int)uVar8,(bool *)&local_488,
             (allocator_type *)&local_3e0);
  for (p_Var6 = pUVar3[3].column_._M_h._M_before_begin._M_nxt; p_Var6 != (_Hash_node_base *)0x0;
      p_Var6 = p_Var6->_M_nxt) {
    uVar2 = *(uint *)&p_Var6[1]._M_nxt[3]._M_nxt;
    if (uVar2 < uVar8) {
      ((__node_base_ptr)((long)local_4b8 + (ulong)(uVar2 >> 6) * 8))->_M_nxt =
           (_Hash_node_base *)
           ((ulong)((__node_base_ptr)((long)local_4b8 + (ulong)(uVar2 >> 6) * 8))->_M_nxt |
           1L << ((byte)uVar2 & 0x3f));
    }
  }
LAB_0015e8fb:
  __last1_04.super__Bit_iterator_base._M_offset = (uint)local_4a0;
  __last1_04.super__Bit_iterator_base._M_p = (_Bit_type *)sStack_4a8.pi_;
  if (((ulong)local_4a0 & 0xffffffff) + ((long)sStack_4a8.pi_ - (long)local_4b8) * 8 ==
      (ulong)local_4c8 + (local_4d0 - (long)local_4e0) * 8) {
    __first1_04.super__Bit_iterator_base._8_8_ = 0;
    __first1_04.super__Bit_iterator_base._M_p = (_Bit_type *)local_4b8;
    __last1_04.super__Bit_iterator_base._12_4_ = 0;
    __first2_04.super__Bit_iterator_base._8_8_ = 0;
    __first2_04.super__Bit_iterator_base._M_p = (_Bit_type *)local_4e0;
    bVar5 = std::__equal<false>::equal<std::_Bit_const_iterator,std::_Bit_const_iterator>
                      (__first1_04,__last1_04,__first2_04);
  }
  else {
    bVar5 = false;
  }
  local_368 = (__node_base *)CONCAT71(local_368._1_7_,bVar5);
  local_360 = (char *)0x0;
  sStack_358.pi_ = (sp_counted_base *)0x0;
  local_3e0._M_nxt = (_Hash_node_base *)0x1ec689;
  local_3d8 = "";
  pcStack_480 = (char *)((ulong)pcStack_480 & 0xffffffffffffff00);
  local_488 = (__node_base_ptr)&PTR__lazy_ostream_002283b0;
  sStack_478.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_250 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_248 = "";
  local_470 = &local_3e0;
  boost::test_tools::tt_detail::report_assertion(&local_368,&local_488,&local_250,1000,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_358);
  if (local_4b8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_4b8,(long)local_498 - (long)local_4b8);
  }
  local_260 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_258 = "";
  local_274._4_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_260,0x3ea);
  local_360 = (char *)((ulong)local_360 & 0xffffffffffffff00);
  local_368 = (__node_base *)&PTR__lazy_ostream_00228440;
  sStack_358.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_350 = "";
  local_2e0._M_nxt =
       (_Hash_node_base *)
       (matrix->
       super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start[3].column_._M_h._M_element_count;
  local_460._M_nxt = (_Hash_node_base *)local_274;
  local_3e0._M_nxt._0_1_ = local_2e0._M_nxt == (_Hash_node_base *)0x4;
  local_274._0_4_ = 4;
  local_3d8 = (char *)0x0;
  sStack_3d0.pi_ = (sp_counted_base *)0x0;
  local_458._M_nxt = (_Hash_node_base *)0x1e68bf;
  local_450 = "";
  local_490._M_nxt = &local_2e0;
  puStack_4b0 = (pointer)((ulong)puStack_4b0 & 0xffffffffffffff00);
  local_4b8 = (undefined1  [8])&PTR__lazy_ostream_00228400;
  sStack_4a8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_4a0 = &local_490;
  pcStack_480 = (char *)((ulong)pcStack_480 & 0xffffffffffffff00);
  local_488 = (__node_base_ptr)&PTR__lazy_ostream_002286c0;
  sStack_478.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_470 = &local_460;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_3d0);
  for (; col4.column_._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0;
      col4.column_._M_h._M_before_begin._M_nxt = (col4.column_._M_h._M_before_begin._M_nxt)->_M_nxt)
  {
    p_Var6 = col4.column_._M_h._M_before_begin._M_nxt[1]._M_nxt;
    if (((col4.super_Row_access_option.rows_ != (Row_container *)0x0) ||
        (p_Var6 != (_Hash_node_base *)0x0)) &&
       (p_Var4 = p_Var6[1]._M_nxt, p_Var4 != (_Hash_node_base *)0x0)) {
      p_Var7 = p_Var6[2]._M_nxt;
      p_Var7->_M_nxt = p_Var4;
      p_Var4[1]._M_nxt = p_Var7;
    }
    operator_delete(p_Var6,0x20);
  }
  std::
  _Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_*>,_std::__detail::_Identity,_Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>,_Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&col4.column_._M_h);
  for (; col3.column_._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0;
      col3.column_._M_h._M_before_begin._M_nxt = (col3.column_._M_h._M_before_begin._M_nxt)->_M_nxt)
  {
    p_Var6 = col3.column_._M_h._M_before_begin._M_nxt[1]._M_nxt;
    if (((col3.super_Row_access_option.rows_ != (Row_container *)0x0) ||
        (p_Var6 != (_Hash_node_base *)0x0)) &&
       (p_Var4 = p_Var6[1]._M_nxt, p_Var4 != (_Hash_node_base *)0x0)) {
      p_Var7 = p_Var6[2]._M_nxt;
      p_Var7->_M_nxt = p_Var4;
      p_Var4[1]._M_nxt = p_Var7;
    }
    operator_delete(p_Var6,0x20);
  }
  std::
  _Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_*>,_std::__detail::_Identity,_Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>,_Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&col3.column_._M_h);
  for (; col2.column_._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0;
      col2.column_._M_h._M_before_begin._M_nxt = (col2.column_._M_h._M_before_begin._M_nxt)->_M_nxt)
  {
    p_Var6 = col2.column_._M_h._M_before_begin._M_nxt[1]._M_nxt;
    if (((col2.super_Row_access_option.rows_ != (Row_container *)0x0) ||
        (p_Var6 != (_Hash_node_base *)0x0)) &&
       (p_Var4 = p_Var6[1]._M_nxt, p_Var4 != (_Hash_node_base *)0x0)) {
      p_Var7 = p_Var6[2]._M_nxt;
      p_Var7->_M_nxt = p_Var4;
      p_Var4[1]._M_nxt = p_Var7;
    }
    operator_delete(p_Var6,0x20);
  }
  std::
  _Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_*>,_std::__detail::_Identity,_Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>,_Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&col2.column_._M_h);
  for (; col1.column_._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0;
      col1.column_._M_h._M_before_begin._M_nxt = (col1.column_._M_h._M_before_begin._M_nxt)->_M_nxt)
  {
    p_Var6 = col1.column_._M_h._M_before_begin._M_nxt[1]._M_nxt;
    if (((col1.super_Row_access_option.rows_ != (Row_container *)0x0) ||
        (p_Var6 != (_Hash_node_base *)0x0)) &&
       (p_Var4 = p_Var6[1]._M_nxt, p_Var4 != (_Hash_node_base *)0x0)) {
      p_Var7 = p_Var6[2]._M_nxt;
      p_Var7->_M_nxt = p_Var4;
      p_Var4[1]._M_nxt = p_Var7;
    }
    operator_delete(p_Var6,0x20);
  }
  std::
  _Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_*>,_std::__detail::_Identity,_Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>,_Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&col1.column_._M_h);
  for (; col0.column_._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0;
      col0.column_._M_h._M_before_begin._M_nxt = (col0.column_._M_h._M_before_begin._M_nxt)->_M_nxt)
  {
    p_Var6 = col0.column_._M_h._M_before_begin._M_nxt[1]._M_nxt;
    if (((col0.super_Row_access_option.rows_ != (Row_container *)0x0) ||
        (p_Var6 != (_Hash_node_base *)0x0)) &&
       (p_Var4 = p_Var6[1]._M_nxt, p_Var4 != (_Hash_node_base *)0x0)) {
      p_Var7 = p_Var6[2]._M_nxt;
      p_Var7->_M_nxt = p_Var4;
      p_Var4[1]._M_nxt = p_Var7;
    }
    operator_delete(p_Var6,0x20);
  }
  std::
  _Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_*>,_std::__detail::_Identity,_Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>,_Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&col0.column_._M_h);
  if (local_4e0 != (void *)0x0) {
    operator_delete(local_4e0,local_4c0 - (long)local_4e0);
  }
  return;
}

Assistant:

void column_test_boundary_z2_operators(std::vector<Column>& matrix) {
  using cont = std::vector<unsigned int>;

  std::vector<bool> veccont;
  typename Column::Column_settings settings;

  const Column col0(cont{0, 1, 2, 5, 6}, &settings);
  matrix[0] += col0;

  veccont = {0, 0, 1, 1, 0, 0, 1};
  BOOST_CHECK(matrix[0].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[0].size(), 3);
  }

  const Column col1(cont{0, 1, 2, 5, 6}, &settings);
  matrix[1] += col1;

  veccont = {};
  BOOST_CHECK(matrix[1].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[1].size(), 0);
  }

  // this = v * this + column
  matrix[4].multiply_target_and_add(3, col1);
  veccont = {0, 0, 1, 1, 0, 0, 1};
  BOOST_CHECK(matrix[4].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[4].size(), 3);
  }
  // this = this + column * v
  const Column col2(cont{}, &settings);
  matrix[5].multiply_source_and_add(col2, 3);
  veccont = {1, 1, 1, 0, 0, 1, 1};
  BOOST_CHECK(matrix[5].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[5].size(), 5);
  }
  // this = this + column * v
  const Column col3(cont{2, 3, 6}, &settings);
  matrix[5].multiply_source_and_add(col3, 3);
  veccont = {1, 1, 0, 1, 0, 1, 0};
  BOOST_CHECK(matrix[5].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[5].size(), 4);
  }
  // this = v * this + column
  const Column col4(cont{0, 1, 3, 5}, &settings);
  matrix[3].multiply_target_and_add(4, col4);
  veccont = {1, 1, 0, 1, 0, 1, 0};
  BOOST_CHECK(matrix[3].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[3].size(), 4);
  }
}